

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O0

void icu_63::number::impl::blueprint_helpers::parseMeasurePerUnitOption
               (StringSegment *segment,MacroProps *macros,UErrorCode *status)

{
  UBool UVar1;
  undefined1 local_38 [8];
  MeasureUnit numerator;
  UErrorCode *status_local;
  MacroProps *macros_local;
  StringSegment *segment_local;
  
  numerator._16_8_ = status;
  MeasureUnit::MeasureUnit((MeasureUnit *)local_38,&macros->unit);
  parseMeasureUnitOption(segment,macros,(UErrorCode *)numerator._16_8_);
  UVar1 = ::U_FAILURE(*(UErrorCode *)numerator._16_8_);
  if (UVar1 == '\0') {
    MeasureUnit::operator=(&macros->perUnit,&macros->unit);
    MeasureUnit::operator=(&macros->unit,(MeasureUnit *)local_38);
  }
  MeasureUnit::~MeasureUnit((MeasureUnit *)local_38);
  return;
}

Assistant:

void blueprint_helpers::parseMeasurePerUnitOption(const StringSegment& segment, MacroProps& macros,
                                                  UErrorCode& status) {
    // A little bit of a hack: safe the current unit (numerator), call the main measure unit
    // parsing code, put back the numerator unit, and put the new unit into per-unit.
    MeasureUnit numerator = macros.unit;
    parseMeasureUnitOption(segment, macros, status);
    if (U_FAILURE(status)) { return; }
    macros.perUnit = macros.unit;
    macros.unit = numerator;
}